

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O2

string * CEscape(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char cVar2;
  size_t i;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar3 = 0; uVar3 < str->_M_string_length; uVar3 = uVar3 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar3];
    if ((((cVar1 == '\t') || (cVar1 == '\\')) || (cVar1 == '\r')) ||
       ((cVar1 == '\"' || (cVar1 == '\n')))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      cVar2 = (char)__return_storage_ptr__;
      if (0x5e < (byte)(cVar1 - 0x20U)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      std::__cxx11::string::push_back(cVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string CEscape(const std::string& str) {
  std::string dest;

  for (size_t i = 0; i < str.size(); ++i) {
    unsigned char ch = str[i];
    switch (ch) {
      case '\n': dest += "\\n"; break;
      case '\r': dest += "\\r"; break;
      case '\t': dest += "\\t"; break;
      case '\"': dest += "\\\""; break;
      case '\\': dest += "\\\\"; break;
      default:
        if (AsciiIsPrint(ch)) {
          dest += ch;
        } else {
          dest += "\\";
          dest += ToDecimalDigit(ch / 64);
          dest += ToDecimalDigit((ch % 64) / 8);
          dest += ToDecimalDigit(ch % 8);
        }
        break;
    }
  }

  return dest;
}